

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Patterns.cpp
# Opt level: O2

bool slang::ast::StructurePattern::createVars
               (ASTContext *context,StructurePatternSyntax *syntax,Type *targetType,
               SmallVector<const_slang::ast::PatternVarSymbol_*,_5UL> *results)

{
  size_t sVar1;
  PatternSyntax *syntax_00;
  bool bVar2;
  bool bVar3;
  Type *pTVar4;
  Scope *this;
  SyntaxNode *pSVar5;
  Diagnostic *pDVar6;
  StructurePatternMemberSyntax *pSVar7;
  Symbol *pSVar8;
  NamedStructurePatternMemberSyntax *nspms;
  ParentList *pPVar9;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_(std::ranges::subrange_kind)0>
  sVar10;
  SourceRange SVar11;
  string_view name;
  const_iterator __begin3;
  specific_symbol_iterator<slang::ast::FieldSymbol> it;
  SeparatedSyntaxList<slang::syntax::StructurePatternMemberSyntax> *__range3;
  iterator_base<const_slang::syntax::StructurePatternMemberSyntax_*> local_60;
  StructurePatternSyntax *local_50;
  specific_symbol_iterator<slang::ast::FieldSymbol> local_48;
  ParentList *local_40;
  ulong local_38;
  
  bVar2 = Type::isStruct(targetType);
  if ((bVar2) && ((syntax->members).elements._M_extent._M_extent_value != 0)) {
    pPVar9 = &syntax->members;
    pTVar4 = Type::getCanonicalType(targetType);
    this = Symbol::scopeOrNull(&pTVar4->super_Symbol);
    pSVar5 = slang::syntax::TokenOrSyntax::node((syntax->members).elements._M_ptr);
    local_60.list = pPVar9;
    local_40 = pPVar9;
    if (pSVar5->kind != OrderedStructurePatternMember) {
      local_60.index = 0;
      local_38 = (syntax->members).elements._M_extent._M_extent_value + 1 >> 1;
      bVar2 = true;
      local_50 = (StructurePatternSyntax *)this;
      for (; (local_60.list != local_40 || (local_60.index != local_38));
          local_60.index = local_60.index + 1) {
        pSVar7 = slang::syntax::SeparatedSyntaxList<slang::syntax::StructurePatternMemberSyntax>::
                 iterator_base<const_slang::syntax::StructurePatternMemberSyntax_*>::dereference
                           (&local_60);
        name = parsing::Token::valueText((Token *)(pSVar7 + 1));
        pSVar8 = Scope::find((Scope *)local_50,name);
        if (pSVar8 == (Symbol *)0x0) {
          if (name._M_len != 0) {
            SVar11 = parsing::Token::range((Token *)(pSVar7 + 1));
            pDVar6 = ASTContext::addDiag(context,(DiagCode)0x3a000a,SVar11);
            pDVar6 = Diagnostic::operator<<(pDVar6,name);
            ast::operator<<(pDVar6,targetType);
          }
          Pattern::createPlaceholderVars
                    (context,(PatternSyntax *)pSVar7[2].super_SyntaxNode.parent,results);
          bVar2 = false;
        }
        else {
          pSVar5 = pSVar7[2].super_SyntaxNode.parent;
          pTVar4 = DeclaredType::getType((DeclaredType *)(pSVar8 + 1));
          bVar3 = Pattern::createPatternVars(context,(PatternSyntax *)pSVar5,pTVar4,results);
          bVar2 = bVar2 != false && bVar3;
        }
      }
      return bVar2;
    }
    sVar10 = Scope::membersOfType<slang::ast::FieldSymbol>(this);
    local_48 = sVar10._M_begin.current;
    local_60.index = 0;
    sVar1 = (syntax->members).elements._M_extent._M_extent_value;
    bVar2 = true;
    local_50 = syntax;
    for (; (local_60.list != pPVar9 || (local_60.index != sVar1 + 1 >> 1));
        local_60.index = local_60.index + 1) {
      pSVar5 = &slang::syntax::SeparatedSyntaxList<slang::syntax::StructurePatternMemberSyntax>::
                iterator_base<const_slang::syntax::StructurePatternMemberSyntax_*>::dereference
                          (&local_60)->super_SyntaxNode;
      syntax_00 = *(PatternSyntax **)(pSVar5 + 1);
      if (local_48.current == sVar10._M_end.current.current) {
        if (bVar2 != false) {
          SVar11 = slang::syntax::SyntaxNode::sourceRange(pSVar5);
          pDVar6 = ASTContext::addDiag(context,(DiagCode)0x860007,SVar11);
          ast::operator<<(pDVar6,targetType);
          bVar2 = false;
        }
        Pattern::createPlaceholderVars(context,syntax_00,results);
      }
      else {
        pTVar4 = DeclaredType::getType((DeclaredType *)(local_48.current + 1));
        bVar3 = Pattern::createPatternVars(context,syntax_00,pTVar4,results);
        bVar2 = (bool)(bVar3 & bVar2);
        Scope::specific_symbol_iterator<slang::ast::FieldSymbol>::increment(&local_48);
        pPVar9 = local_40;
      }
    }
    if (local_48.current == sVar10._M_end.current.current) {
      return bVar2;
    }
    SVar11 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)local_50);
    pDVar6 = ASTContext::addDiag(context,(DiagCode)0x850007,SVar11);
    ast::operator<<(pDVar6,targetType);
  }
  else {
    bVar2 = Type::isError(targetType);
    if ((!bVar2) && ((syntax->members).elements._M_extent._M_extent_value != 0)) {
      SVar11 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
      pDVar6 = ASTContext::addDiag(context,(DiagCode)0x870007,SVar11);
      ast::operator<<(pDVar6,targetType);
    }
    Pattern::createPlaceholderVars(context,&syntax->super_PatternSyntax,results);
  }
  return false;
}

Assistant:

bool StructurePattern::createVars(const ASTContext& context,
                                  const syntax::StructurePatternSyntax& syntax,
                                  const Type& targetType,
                                  SmallVector<const PatternVarSymbol*>& results) {
    if (!targetType.isStruct() || syntax.members.empty()) {
        if (!targetType.isError() && !syntax.members.empty())
            context.addDiag(diag::PatternStructType, syntax.sourceRange()) << targetType;

        createPlaceholderVars(context, syntax, results);
        return false;
    }

    bool result = true;
    auto& structScope = targetType.getCanonicalType().as<Scope>();

    if (syntax.members[0]->kind == SyntaxKind::OrderedStructurePatternMember) {
        auto fields = structScope.membersOfType<FieldSymbol>();
        auto it = fields.begin();
        for (auto memberSyntax : syntax.members) {
            auto& patternSyntax = *memberSyntax->as<OrderedStructurePatternMemberSyntax>().pattern;
            if (it == fields.end()) {
                if (result) {
                    context.addDiag(diag::PatternStructTooMany, memberSyntax->sourceRange())
                        << targetType;
                    result = false;
                }

                createPlaceholderVars(context, patternSyntax, results);
                continue;
            }

            result &= createPatternVars(context, patternSyntax, it->getType(), results);
            it++;
        }

        if (it != fields.end()) {
            context.addDiag(diag::PatternStructTooFew, syntax.sourceRange()) << targetType;
            result = false;
        }
    }
    else {
        for (auto memberSyntax : syntax.members) {
            auto& nspms = memberSyntax->as<NamedStructurePatternMemberSyntax>();
            auto memberName = nspms.name.valueText();
            auto member = structScope.find(memberName);
            if (!member) {
                if (!memberName.empty()) {
                    auto& diag = context.addDiag(diag::UnknownMember, nspms.name.range());
                    diag << memberName << targetType;
                }

                createPlaceholderVars(context, *nspms.pattern, results);
                result = false;
                continue;
            }

            auto& field = member->as<FieldSymbol>();
            result &= createPatternVars(context, *nspms.pattern, field.getType(), results);
        }
    }

    return result;
}